

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.h
# Opt level: O2

void Rasterizer::doRender<RasterizerA2>(RasterizerA2 *self,uint32_t argb32)

{
  int32_t *piVar1;
  int32_t *piVar2;
  uint8_t *puVar3;
  uint uVar4;
  int iVar5;
  Image *pIVar6;
  long lVar7;
  Bounds *pBVar8;
  size_t sVar9;
  Cell *pCVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint32_t uVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  int iVar31;
  ulong uVar32;
  uint8_t *puVar33;
  ulong uVar34;
  bool bVar35;
  short sVar36;
  short sVar37;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  undefined1 auVar38 [16];
  short sVar46;
  short sVar47;
  undefined1 in_XMM1 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar50 [16];
  int iVar52;
  int iVar55;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar57 [16];
  undefined1 in_XMM7 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [12];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  int iVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  short sVar79;
  short sVar85;
  short sVar86;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  int iVar90;
  int iVar91;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  int iVar96;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  short sVar51;
  short sVar56;
  short sVar60;
  undefined1 auVar68 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  short sVar71;
  ushort uVar72;
  short sVar73;
  ushort uVar74;
  undefined1 auVar80 [12];
  undefined1 auVar83 [16];
  
  uVar4 = (self->super_CellRasterizer).super_Rasterizer._options;
  if ((self->super_CellRasterizer).super_Rasterizer._fillMode != 1) {
    if ((uVar4 & 1) != 0) {
      uVar34 = (ulong)(self->_yBounds).start;
      iVar5 = (self->_yBounds).end;
      pIVar6 = (self->super_CellRasterizer).super_Rasterizer._dst;
      lVar7 = pIVar6->_stride;
      puVar33 = pIVar6->_data + lVar7 * uVar34;
      uVar27 = PixelUtils::premultiply(argb32);
      auVar26 = _DAT_00110170;
      auVar25 = _DAT_00110140;
      auVar38._4_4_ = uVar27;
      auVar38._0_4_ = uVar27;
      auVar38._8_4_ = uVar27;
      auVar38._12_4_ = uVar27;
      auVar38 = pmovzxbw(auVar38,auVar38);
      lVar28 = uVar34 * 8;
      auVar48 = pmovsxwd(in_XMM1,0x1ff01ff01ff01ff);
      auVar49 = pmovzxbw(in_XMM2,0xffffffffffffffff);
      auVar50 = pmovzxbw(in_XMM3,0x8080808080808080);
      auVar57 = pmovzxbw(in_XMM7,0xffffffffffffffff);
      auVar58 = pmovzxbw(in_XMM8,0x8080808080808080);
      for (; uVar34 <= (ulong)(long)iVar5; uVar34 = uVar34 + 1) {
        pBVar8 = self->_xBounds;
        if (pBVar8[uVar34].end != 0) {
          sVar9 = self->_cellStride;
          pCVar10 = self->_cells;
          uVar29 = (ulong)pBVar8[uVar34].start;
          iVar31 = pBVar8[uVar34].end + 1;
          iVar96 = (self->super_CellRasterizer).super_Rasterizer._width;
          if (iVar96 < iVar31) {
            iVar31 = iVar96;
          }
          pBVar8[uVar34].start = 0x7fffffff;
          pBVar8[uVar34].end = 0;
          uVar32 = (long)iVar31 - uVar29;
          iVar96 = 0;
          sVar37 = auVar38._0_2_;
          sVar39 = auVar38._2_2_;
          sVar40 = auVar38._4_2_;
          sVar41 = auVar38._6_2_;
          sVar42 = auVar38._8_2_;
          sVar43 = auVar38._10_2_;
          sVar45 = auVar38._12_2_;
          sVar47 = auVar38._14_2_;
          if (3 < uVar32) {
            uVar32 = uVar32 >> 2;
            lVar30 = sVar9 * lVar28;
            while (bVar35 = uVar32 != 0, uVar32 = uVar32 - 1, bVar35) {
              piVar1 = (int32_t *)((long)&pCVar10[uVar29].cover + lVar30);
              iVar75 = *piVar1;
              piVar2 = (int32_t *)((long)&pCVar10[uVar29 + 2].cover + lVar30);
              iVar55 = iVar75 + piVar1[2];
              auVar76._4_4_ = iVar55;
              auVar76._0_4_ = iVar75;
              auVar76._8_8_ = 0;
              iVar52 = iVar75 + iVar96;
              iVar90 = iVar55 + iVar96;
              iVar91 = piVar1[2] + *piVar2 + iVar96;
              iVar96 = *piVar2 + piVar2[2] + iVar96 + iVar55;
              auVar94._0_4_ = iVar52 - ((uint)piVar1[1] >> 9);
              auVar94._4_4_ = iVar90 - ((uint)piVar1[3] >> 9);
              auVar94._8_4_ = (iVar91 + iVar75) - ((uint)piVar2[1] >> 9);
              auVar94._12_4_ = iVar96 - ((uint)piVar2[3] >> 9);
              auVar77 = packusdw(auVar94 & auVar48,auVar94 & auVar48);
              iVar75 = 0x1ff01ff - auVar77._0_4_;
              iVar52 = 0x1ff01ff - auVar77._4_4_;
              iVar55 = 0x1ff01ff - auVar77._8_4_;
              iVar90 = 0x1ff01ff - auVar77._12_4_;
              sVar36 = auVar77._0_2_;
              sVar79 = (short)iVar75;
              sVar51 = auVar77._2_2_;
              sVar85 = (short)((uint)iVar75 >> 0x10);
              sVar56 = auVar77._4_2_;
              sVar86 = (short)iVar52;
              uVar72 = (ushort)(sVar56 < sVar86) * sVar56 | (ushort)(sVar56 >= sVar86) * sVar86;
              sVar56 = auVar77._6_2_;
              sVar86 = (short)((uint)iVar52 >> 0x10);
              uVar74 = (ushort)(sVar56 < sVar86) * sVar56 | (ushort)(sVar56 >= sVar86) * sVar86;
              auVar82._0_8_ =
                   CONCAT26(uVar74,CONCAT24(uVar72,CONCAT22((ushort)(sVar51 < sVar85) * sVar51 |
                                                            (ushort)(sVar51 >= sVar85) * sVar85,
                                                            (ushort)(sVar36 < sVar79) * sVar36 |
                                                            (ushort)(sVar36 >= sVar79) * sVar79)));
              sVar36 = auVar77._8_2_;
              sVar51 = (short)iVar55;
              auVar80._0_10_ =
                   CONCAT28((ushort)(sVar36 < sVar51) * sVar36 | (ushort)(sVar36 >= sVar51) * sVar51
                            ,auVar82._0_8_);
              sVar36 = auVar77._10_2_;
              sVar51 = (short)((uint)iVar55 >> 0x10);
              auVar80._10_2_ =
                   (ushort)(sVar36 < sVar51) * sVar36 | (ushort)(sVar36 >= sVar51) * sVar51;
              sVar36 = auVar77._12_2_;
              sVar51 = (short)iVar90;
              sVar56 = (short)((uint)iVar90 >> 0x10);
              auVar88._12_2_ =
                   (ushort)(sVar36 < sVar51) * sVar36 | (ushort)(sVar36 >= sVar51) * sVar51;
              auVar88._0_12_ = auVar80;
              sVar36 = auVar77._14_2_;
              auVar88._14_2_ =
                   (ushort)(sVar36 < sVar56) * sVar36 | (ushort)(sVar36 >= sVar56) * sVar56;
              auVar88 = pshuflw(auVar76 << 0x40,auVar88,0x50);
              auVar95._12_2_ = uVar74;
              auVar95._0_12_ = auVar80;
              auVar95._14_2_ = uVar74;
              auVar83._12_4_ = auVar95._12_4_;
              auVar83._10_2_ = uVar72;
              auVar83._0_10_ = auVar80._0_10_;
              auVar82._10_6_ = auVar83._10_6_;
              auVar82._8_2_ = uVar72;
              *(undefined1 (*) [16])((long)&pCVar10[uVar29].cover + lVar30) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])((long)&pCVar10[uVar29 + 2].cover + lVar30) =
                   (undefined1  [16])0x0;
              auVar76 = *(undefined1 (*) [16])(puVar33 + uVar29 * 4);
              auVar95 = pmovzxbw(auVar77,auVar76);
              auVar89._0_4_ = auVar88._0_4_;
              auVar89._4_4_ = auVar89._0_4_;
              auVar89._8_4_ = auVar88._4_4_;
              auVar89._12_4_ = auVar88._4_4_;
              auVar77._4_4_ = auVar82._8_4_;
              auVar77._0_4_ = auVar82._8_4_;
              auVar77._8_4_ = auVar83._12_4_;
              auVar77._12_4_ = auVar83._12_4_;
              auVar89 = auVar89 ^ auVar57;
              auVar77 = auVar77 ^ auVar57;
              auVar97._0_2_ = auVar88._0_2_ * sVar37 + auVar58._0_2_ + auVar89._0_2_ * auVar95._0_2_
              ;
              auVar97._2_2_ = auVar88._2_2_ * sVar39 + auVar58._2_2_ + auVar89._2_2_ * auVar95._2_2_
              ;
              auVar97._4_2_ = auVar88._0_2_ * sVar40 + auVar58._4_2_ + auVar89._4_2_ * auVar95._4_2_
              ;
              auVar97._6_2_ = auVar88._2_2_ * sVar41 + auVar58._6_2_ + auVar89._6_2_ * auVar95._6_2_
              ;
              auVar97._8_2_ = auVar88._4_2_ * sVar42 + auVar58._8_2_ + auVar89._8_2_ * auVar95._8_2_
              ;
              auVar97._10_2_ =
                   auVar88._6_2_ * sVar43 + auVar58._10_2_ + auVar89._10_2_ * auVar95._10_2_;
              auVar97._12_2_ =
                   auVar88._4_2_ * sVar45 + auVar58._12_2_ + auVar89._12_2_ * auVar95._12_2_;
              auVar97._14_2_ =
                   auVar88._6_2_ * sVar47 + auVar58._14_2_ + auVar89._14_2_ * auVar95._14_2_;
              auVar88 = pmulhuw(auVar97,auVar25);
              auVar84._0_2_ = uVar72 * sVar37 + auVar58._0_2_ + auVar77._0_2_ * (ushort)auVar76[8];
              auVar84._2_2_ = uVar72 * sVar39 + auVar58._2_2_ + auVar77._2_2_ * (ushort)auVar76[9];
              auVar84._4_2_ = uVar72 * sVar40 + auVar58._4_2_ + auVar77._4_2_ * (ushort)auVar76[10];
              auVar84._6_2_ = uVar72 * sVar41 + auVar58._6_2_ + auVar77._6_2_ * (ushort)auVar76[0xb]
              ;
              auVar84._8_2_ = uVar74 * sVar42 + auVar58._8_2_ + auVar77._8_2_ * (ushort)auVar76[0xc]
              ;
              auVar84._10_2_ =
                   uVar74 * sVar43 + auVar58._10_2_ + auVar77._10_2_ * (ushort)auVar76[0xd];
              auVar84._12_2_ =
                   uVar74 * sVar45 + auVar58._12_2_ + auVar77._12_2_ * (ushort)auVar76[0xe];
              auVar84._14_2_ =
                   uVar74 * sVar47 + auVar58._14_2_ + auVar77._14_2_ * (ushort)auVar76[0xf];
              auVar76 = pmulhuw(auVar84,auVar25);
              sVar36 = auVar88._0_2_;
              sVar51 = auVar88._2_2_;
              sVar56 = auVar88._4_2_;
              sVar79 = auVar88._6_2_;
              sVar85 = auVar88._8_2_;
              sVar86 = auVar88._10_2_;
              sVar44 = auVar88._12_2_;
              sVar46 = auVar88._14_2_;
              sVar60 = auVar76._0_2_;
              sVar71 = auVar76._2_2_;
              sVar73 = auVar76._4_2_;
              sVar11 = auVar76._6_2_;
              sVar12 = auVar76._8_2_;
              sVar13 = auVar76._10_2_;
              sVar14 = auVar76._12_2_;
              sVar15 = auVar76._14_2_;
              puVar3 = puVar33 + uVar29 * 4;
              *puVar3 = (0 < sVar36) * (sVar36 < 0x100) * auVar88[0] - (0xff < sVar36);
              puVar3[1] = (0 < sVar51) * (sVar51 < 0x100) * auVar88[2] - (0xff < sVar51);
              puVar3[2] = (0 < sVar56) * (sVar56 < 0x100) * auVar88[4] - (0xff < sVar56);
              puVar3[3] = (0 < sVar79) * (sVar79 < 0x100) * auVar88[6] - (0xff < sVar79);
              puVar3[4] = (0 < sVar85) * (sVar85 < 0x100) * auVar88[8] - (0xff < sVar85);
              puVar3[5] = (0 < sVar86) * (sVar86 < 0x100) * auVar88[10] - (0xff < sVar86);
              puVar3[6] = (0 < sVar44) * (sVar44 < 0x100) * auVar88[0xc] - (0xff < sVar44);
              puVar3[7] = (0 < sVar46) * (sVar46 < 0x100) * auVar88[0xe] - (0xff < sVar46);
              puVar3[8] = (0 < sVar60) * (sVar60 < 0x100) * auVar76[0] - (0xff < sVar60);
              puVar3[9] = (0 < sVar71) * (sVar71 < 0x100) * auVar76[2] - (0xff < sVar71);
              puVar3[10] = (0 < sVar73) * (sVar73 < 0x100) * auVar76[4] - (0xff < sVar73);
              puVar3[0xb] = (0 < sVar11) * (sVar11 < 0x100) * auVar76[6] - (0xff < sVar11);
              puVar3[0xc] = (0 < sVar12) * (sVar12 < 0x100) * auVar76[8] - (0xff < sVar12);
              puVar3[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar76[10] - (0xff < sVar13);
              puVar3[0xe] = (0 < sVar14) * (sVar14 < 0x100) * auVar76[0xc] - (0xff < sVar14);
              puVar3[0xf] = (0 < sVar15) * (sVar15 < 0x100) * auVar76[0xe] - (0xff < sVar15);
              uVar29 = uVar29 + 4;
            }
          }
          lVar30 = sVar9 * lVar28;
          iVar75 = iVar96;
          for (; uVar29 < (ulong)(long)iVar31; uVar29 = uVar29 + 1) {
            iVar75 = iVar75 + *(int32_t *)((long)&pCVar10[uVar29].cover + lVar30);
            *(undefined8 *)((long)&pCVar10[uVar29].cover + lVar30) = 0;
            auVar81._0_4_ = iVar75 - ((uint)*(int32_t *)((long)&pCVar10[uVar29].area + lVar30) >> 9)
            ;
            auVar81._4_4_ = iVar96;
            auVar81._8_4_ = iVar96;
            auVar81._12_4_ = iVar96;
            auVar76 = packusdw(auVar81 & auVar48,auVar81 & auVar48);
            iVar52 = auVar48._0_4_ - auVar76._0_4_;
            iVar55 = auVar48._4_4_ - auVar76._4_4_;
            iVar90 = auVar48._8_4_ - auVar76._8_4_;
            iVar91 = auVar48._12_4_ - auVar76._12_4_;
            sVar36 = auVar76._0_2_;
            sVar51 = (short)iVar52;
            auVar53._0_2_ = (ushort)(sVar36 < sVar51) * sVar36 | (ushort)(sVar36 >= sVar51) * sVar51
            ;
            sVar36 = auVar76._2_2_;
            sVar51 = (short)((uint)iVar52 >> 0x10);
            auVar53._2_2_ = (ushort)(sVar36 < sVar51) * sVar36 | (ushort)(sVar36 >= sVar51) * sVar51
            ;
            sVar36 = auVar76._4_2_;
            sVar51 = (short)iVar55;
            auVar53._4_2_ = (ushort)(sVar36 < sVar51) * sVar36 | (ushort)(sVar36 >= sVar51) * sVar51
            ;
            sVar36 = auVar76._6_2_;
            sVar51 = (short)((uint)iVar55 >> 0x10);
            auVar53._6_2_ = (ushort)(sVar36 < sVar51) * sVar36 | (ushort)(sVar36 >= sVar51) * sVar51
            ;
            sVar36 = auVar76._8_2_;
            sVar51 = (short)iVar90;
            auVar53._8_2_ = (ushort)(sVar36 < sVar51) * sVar36 | (ushort)(sVar36 >= sVar51) * sVar51
            ;
            sVar36 = auVar76._10_2_;
            sVar51 = (short)((uint)iVar90 >> 0x10);
            auVar53._10_2_ =
                 (ushort)(sVar36 < sVar51) * sVar36 | (ushort)(sVar36 >= sVar51) * sVar51;
            sVar36 = auVar76._12_2_;
            sVar51 = (short)iVar91;
            sVar56 = (short)((uint)iVar91 >> 0x10);
            auVar53._12_2_ =
                 (ushort)(sVar36 < sVar51) * sVar36 | (ushort)(sVar36 >= sVar51) * sVar51;
            sVar36 = auVar76._14_2_;
            auVar53._14_2_ =
                 (ushort)(sVar36 < sVar56) * sVar36 | (ushort)(sVar36 >= sVar56) * sVar56;
            auVar76 = pshuflw(auVar53,auVar53,0);
            auVar88 = pmovzxbw(ZEXT416(*(uint *)(puVar33 + uVar29 * 4)),
                               ZEXT416(*(uint *)(puVar33 + uVar29 * 4)));
            auVar77 = auVar76 ^ auVar49;
            auVar54._0_2_ = auVar77._0_2_ * auVar88._0_2_ + auVar76._0_2_ * sVar37 + auVar50._0_2_;
            auVar54._2_2_ = auVar77._2_2_ * auVar88._2_2_ + auVar76._2_2_ * sVar39 + auVar50._2_2_;
            auVar54._4_2_ = auVar77._4_2_ * auVar88._4_2_ + auVar76._4_2_ * sVar40 + auVar50._4_2_;
            auVar54._6_2_ = auVar77._6_2_ * auVar88._6_2_ + auVar76._6_2_ * sVar41 + auVar50._6_2_;
            auVar54._8_2_ = auVar77._8_2_ * auVar88._8_2_ + auVar76._8_2_ * sVar42 + auVar50._8_2_;
            auVar54._10_2_ =
                 auVar77._10_2_ * auVar88._10_2_ + auVar76._10_2_ * sVar43 + auVar50._10_2_;
            auVar54._12_2_ =
                 auVar77._12_2_ * auVar88._12_2_ + auVar76._12_2_ * sVar45 + auVar50._12_2_;
            auVar54._14_2_ =
                 auVar77._14_2_ * auVar88._14_2_ + auVar76._14_2_ * sVar47 + auVar50._14_2_;
            auVar76 = pmulhuw(auVar54,auVar26);
            sVar36 = auVar76._0_2_;
            sVar51 = auVar76._2_2_;
            sVar56 = auVar76._4_2_;
            sVar79 = auVar76._6_2_;
            *(uint *)(puVar33 + uVar29 * 4) =
                 CONCAT13((0 < sVar79) * (sVar79 < 0x100) * auVar76[6] - (0xff < sVar79),
                          CONCAT12((0 < sVar56) * (sVar56 < 0x100) * auVar76[4] - (0xff < sVar56),
                                   CONCAT11((0 < sVar51) * (sVar51 < 0x100) * auVar76[2] -
                                            (0xff < sVar51),
                                            (0 < sVar36) * (sVar36 < 0x100) * auVar76[0] -
                                            (0xff < sVar36))));
          }
        }
        puVar33 = puVar33 + lVar7;
        lVar28 = lVar28 + 8;
      }
      (self->_yBounds).start = 0x7fffffff;
      (self->_yBounds).end = 0;
      return;
    }
    RasterizerA2::_renderImpl<CompositorScalar,false>(self,argb32);
    return;
  }
  if ((uVar4 & 1) != 0) {
    uVar34 = (ulong)(self->_yBounds).start;
    iVar5 = (self->_yBounds).end;
    pIVar6 = (self->super_CellRasterizer).super_Rasterizer._dst;
    lVar7 = pIVar6->_stride;
    puVar33 = pIVar6->_data + lVar7 * uVar34;
    uVar27 = PixelUtils::premultiply(argb32);
    auVar26 = _DAT_00110170;
    auVar25 = _DAT_00110140;
    auVar48._4_4_ = uVar27;
    auVar48._0_4_ = uVar27;
    auVar48._8_4_ = uVar27;
    auVar48._12_4_ = uVar27;
    auVar38 = pmovzxbw(auVar48,auVar48);
    lVar28 = uVar34 * 8;
    auVar48 = pmovzxbw(in_XMM1,0xffffffffffffffff);
    auVar49 = pmovzxbw(in_XMM2,0xffffffffffffffff);
    auVar50 = pmovzxbw(in_XMM3,0x8080808080808080);
    auVar57 = pmovzxbw(in_XMM6,0x8080808080808080);
    for (; uVar34 <= (ulong)(long)iVar5; uVar34 = uVar34 + 1) {
      pBVar8 = self->_xBounds;
      if (pBVar8[uVar34].end != 0) {
        sVar9 = self->_cellStride;
        pCVar10 = self->_cells;
        uVar29 = (ulong)pBVar8[uVar34].start;
        iVar31 = pBVar8[uVar34].end + 1;
        iVar96 = (self->super_CellRasterizer).super_Rasterizer._width;
        if (iVar96 < iVar31) {
          iVar31 = iVar96;
        }
        pBVar8[uVar34].start = 0x7fffffff;
        pBVar8[uVar34].end = 0;
        uVar32 = (long)iVar31 - uVar29;
        auVar58 = (undefined1  [16])0x0;
        sVar36 = auVar38._0_2_;
        sVar51 = auVar38._2_2_;
        sVar56 = auVar38._4_2_;
        sVar79 = auVar38._6_2_;
        sVar85 = auVar38._8_2_;
        sVar86 = auVar38._10_2_;
        sVar44 = auVar38._12_2_;
        sVar46 = auVar38._14_2_;
        sVar37 = auVar48._0_2_;
        sVar39 = auVar48._2_2_;
        sVar40 = auVar48._4_2_;
        sVar41 = auVar48._6_2_;
        sVar42 = auVar48._8_2_;
        sVar43 = auVar48._10_2_;
        sVar45 = auVar48._12_2_;
        sVar47 = auVar48._14_2_;
        if (3 < uVar32) {
          uVar32 = uVar32 >> 2;
          lVar30 = sVar9 * lVar28;
          while (bVar35 = uVar32 != 0, uVar32 = uVar32 - 1, bVar35) {
            piVar1 = (int32_t *)((long)&pCVar10[uVar29].cover + lVar30);
            iVar96 = *piVar1;
            piVar2 = (int32_t *)((long)&pCVar10[uVar29 + 2].cover + lVar30);
            iVar90 = iVar96 + piVar1[2];
            auVar24._4_4_ = iVar90;
            auVar24._0_4_ = iVar96;
            auVar65._0_4_ = piVar1[1] >> 9;
            auVar65._4_4_ = piVar1[3] >> 9;
            auVar65._8_4_ = piVar2[1] >> 9;
            auVar65._12_4_ = piVar2[3] >> 9;
            auVar24._8_8_ = 0;
            iVar75 = auVar58._0_4_;
            iVar52 = auVar58._4_4_;
            iVar55 = auVar58._8_4_;
            iVar91 = *piVar2 + piVar2[2] + auVar58._12_4_ + iVar90;
            auVar58._4_4_ = iVar91;
            auVar58._0_4_ = iVar91;
            auVar58._8_4_ = iVar91;
            auVar58._12_4_ = iVar91;
            auVar87._0_4_ = (iVar96 + iVar75) - auVar65._0_4_;
            auVar87._4_4_ = (iVar90 + iVar52) - auVar65._4_4_;
            auVar87._8_4_ = (piVar1[2] + *piVar2 + iVar55 + iVar96) - auVar65._8_4_;
            auVar87._12_4_ = iVar91 - auVar65._12_4_;
            auVar76 = pabsd(auVar65,auVar87);
            auVar76 = packssdw(auVar76,auVar76);
            sVar60 = auVar76._0_2_;
            sVar71 = auVar76._2_2_;
            sVar73 = auVar76._4_2_;
            uVar72 = (ushort)(sVar40 < sVar73) * sVar40 | (ushort)(sVar40 >= sVar73) * sVar73;
            sVar73 = auVar76._6_2_;
            uVar74 = (ushort)(sVar41 < sVar73) * sVar41 | (ushort)(sVar41 >= sVar73) * sVar73;
            auVar67._0_8_ =
                 CONCAT26(uVar74,CONCAT24(uVar72,CONCAT22((ushort)(sVar39 < sVar71) * sVar39 |
                                                          (ushort)(sVar39 >= sVar71) * sVar71,
                                                          (ushort)(sVar37 < sVar60) * sVar37 |
                                                          (ushort)(sVar37 >= sVar60) * sVar60)));
            sVar60 = auVar76._8_2_;
            auVar61._0_10_ =
                 CONCAT28((ushort)(sVar42 < sVar60) * sVar42 | (ushort)(sVar42 >= sVar60) * sVar60,
                          auVar67._0_8_);
            sVar60 = auVar76._10_2_;
            auVar61._10_2_ =
                 (ushort)(sVar43 < sVar60) * sVar43 | (ushort)(sVar43 >= sVar60) * sVar60;
            sVar60 = auVar76._12_2_;
            sVar71 = auVar76._14_2_;
            auVar66._12_2_ =
                 (ushort)(sVar45 < sVar60) * sVar45 | (ushort)(sVar45 >= sVar60) * sVar60;
            auVar66._0_12_ = auVar61;
            auVar66._14_2_ =
                 (ushort)(sVar47 < sVar71) * sVar47 | (ushort)(sVar47 >= sVar71) * sVar71;
            auVar77 = pshuflw(auVar24 << 0x40,auVar66,0x50);
            auVar69._12_2_ = uVar74;
            auVar69._0_12_ = auVar61;
            auVar69._14_2_ = uVar74;
            auVar68._12_4_ = auVar69._12_4_;
            auVar68._10_2_ = uVar72;
            auVar68._0_10_ = auVar61._0_10_;
            auVar67._10_6_ = auVar68._10_6_;
            auVar67._8_2_ = uVar72;
            *(undefined1 (*) [16])((long)&pCVar10[uVar29].cover + lVar30) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)&pCVar10[uVar29 + 2].cover + lVar30) =
                 (undefined1  [16])0x0;
            auVar76 = *(undefined1 (*) [16])(puVar33 + uVar29 * 4);
            auVar88 = pmovzxbw(auVar87,auVar76);
            auVar78._0_4_ = auVar77._0_4_;
            auVar78._4_4_ = auVar78._0_4_;
            auVar78._8_4_ = auVar77._4_4_;
            auVar78._12_4_ = auVar77._4_4_;
            auVar70._4_4_ = auVar67._8_4_;
            auVar70._0_4_ = auVar67._8_4_;
            auVar70._8_4_ = auVar68._12_4_;
            auVar70._12_4_ = auVar68._12_4_;
            auVar78 = auVar78 ^ auVar48;
            auVar70 = auVar70 ^ auVar48;
            auVar92._0_2_ = auVar77._0_2_ * sVar36 + auVar57._0_2_ + auVar78._0_2_ * auVar88._0_2_;
            auVar92._2_2_ = auVar77._2_2_ * sVar51 + auVar57._2_2_ + auVar78._2_2_ * auVar88._2_2_;
            auVar92._4_2_ = auVar77._0_2_ * sVar56 + auVar57._4_2_ + auVar78._4_2_ * auVar88._4_2_;
            auVar92._6_2_ = auVar77._2_2_ * sVar79 + auVar57._6_2_ + auVar78._6_2_ * auVar88._6_2_;
            auVar92._8_2_ = auVar77._4_2_ * sVar85 + auVar57._8_2_ + auVar78._8_2_ * auVar88._8_2_;
            auVar92._10_2_ =
                 auVar77._6_2_ * sVar86 + auVar57._10_2_ + auVar78._10_2_ * auVar88._10_2_;
            auVar92._12_2_ =
                 auVar77._4_2_ * sVar44 + auVar57._12_2_ + auVar78._12_2_ * auVar88._12_2_;
            auVar92._14_2_ =
                 auVar77._6_2_ * sVar46 + auVar57._14_2_ + auVar78._14_2_ * auVar88._14_2_;
            auVar77 = pmulhuw(auVar92,auVar25);
            auVar93._0_2_ = uVar72 * sVar36 + auVar57._0_2_ + auVar70._0_2_ * (ushort)auVar76[8];
            auVar93._2_2_ = uVar72 * sVar51 + auVar57._2_2_ + auVar70._2_2_ * (ushort)auVar76[9];
            auVar93._4_2_ = uVar72 * sVar56 + auVar57._4_2_ + auVar70._4_2_ * (ushort)auVar76[10];
            auVar93._6_2_ = uVar72 * sVar79 + auVar57._6_2_ + auVar70._6_2_ * (ushort)auVar76[0xb];
            auVar93._8_2_ = uVar74 * sVar85 + auVar57._8_2_ + auVar70._8_2_ * (ushort)auVar76[0xc];
            auVar93._10_2_ =
                 uVar74 * sVar86 + auVar57._10_2_ + auVar70._10_2_ * (ushort)auVar76[0xd];
            auVar93._12_2_ =
                 uVar74 * sVar44 + auVar57._12_2_ + auVar70._12_2_ * (ushort)auVar76[0xe];
            auVar93._14_2_ =
                 uVar74 * sVar46 + auVar57._14_2_ + auVar70._14_2_ * (ushort)auVar76[0xf];
            auVar76 = pmulhuw(auVar93,auVar25);
            sVar60 = auVar77._0_2_;
            sVar71 = auVar77._2_2_;
            sVar73 = auVar77._4_2_;
            sVar11 = auVar77._6_2_;
            sVar12 = auVar77._8_2_;
            sVar13 = auVar77._10_2_;
            sVar14 = auVar77._12_2_;
            sVar15 = auVar77._14_2_;
            sVar16 = auVar76._0_2_;
            sVar17 = auVar76._2_2_;
            sVar18 = auVar76._4_2_;
            sVar19 = auVar76._6_2_;
            sVar20 = auVar76._8_2_;
            sVar21 = auVar76._10_2_;
            sVar22 = auVar76._12_2_;
            sVar23 = auVar76._14_2_;
            puVar3 = puVar33 + uVar29 * 4;
            *puVar3 = (0 < sVar60) * (sVar60 < 0x100) * auVar77[0] - (0xff < sVar60);
            puVar3[1] = (0 < sVar71) * (sVar71 < 0x100) * auVar77[2] - (0xff < sVar71);
            puVar3[2] = (0 < sVar73) * (sVar73 < 0x100) * auVar77[4] - (0xff < sVar73);
            puVar3[3] = (0 < sVar11) * (sVar11 < 0x100) * auVar77[6] - (0xff < sVar11);
            puVar3[4] = (0 < sVar12) * (sVar12 < 0x100) * auVar77[8] - (0xff < sVar12);
            puVar3[5] = (0 < sVar13) * (sVar13 < 0x100) * auVar77[10] - (0xff < sVar13);
            puVar3[6] = (0 < sVar14) * (sVar14 < 0x100) * auVar77[0xc] - (0xff < sVar14);
            puVar3[7] = (0 < sVar15) * (sVar15 < 0x100) * auVar77[0xe] - (0xff < sVar15);
            puVar3[8] = (0 < sVar16) * (sVar16 < 0x100) * auVar76[0] - (0xff < sVar16);
            puVar3[9] = (0 < sVar17) * (sVar17 < 0x100) * auVar76[2] - (0xff < sVar17);
            puVar3[10] = (0 < sVar18) * (sVar18 < 0x100) * auVar76[4] - (0xff < sVar18);
            puVar3[0xb] = (0 < sVar19) * (sVar19 < 0x100) * auVar76[6] - (0xff < sVar19);
            puVar3[0xc] = (0 < sVar20) * (sVar20 < 0x100) * auVar76[8] - (0xff < sVar20);
            puVar3[0xd] = (0 < sVar21) * (sVar21 < 0x100) * auVar76[10] - (0xff < sVar21);
            puVar3[0xe] = (0 < sVar22) * (sVar22 < 0x100) * auVar76[0xc] - (0xff < sVar22);
            puVar3[0xf] = (0 < sVar23) * (sVar23 < 0x100) * auVar76[0xe] - (0xff < sVar23);
            uVar29 = uVar29 + 4;
          }
        }
        lVar30 = sVar9 * lVar28;
        for (; uVar29 < (ulong)(long)iVar31; uVar29 = uVar29 + 1) {
          iVar96 = *(int32_t *)((long)&pCVar10[uVar29].cover + lVar30);
          *(undefined8 *)((long)&pCVar10[uVar29].cover + lVar30) = 0;
          auVar59._0_4_ = auVar58._0_4_ + iVar96;
          auVar59._4_4_ = auVar58._4_4_;
          auVar59._8_4_ = auVar58._8_4_;
          auVar59._12_4_ = auVar58._12_4_;
          auVar62._0_4_ = auVar59._0_4_ - (*(int32_t *)((long)&pCVar10[uVar29].area + lVar30) >> 9);
          auVar62._4_4_ = auVar59._4_4_;
          auVar62._8_4_ = auVar59._8_4_;
          auVar62._12_4_ = auVar59._12_4_;
          auVar58 = pabsd(auVar62,auVar62);
          auVar58 = packssdw(auVar58,auVar58);
          auVar58 = pshuflw(auVar58,auVar58,0);
          sVar60 = auVar58._0_2_;
          auVar63._0_2_ = (ushort)(sVar37 < sVar60) * sVar37 | (ushort)(sVar37 >= sVar60) * sVar60;
          sVar60 = auVar58._2_2_;
          auVar63._2_2_ = (ushort)(sVar39 < sVar60) * sVar39 | (ushort)(sVar39 >= sVar60) * sVar60;
          sVar60 = auVar58._4_2_;
          auVar63._4_2_ = (ushort)(sVar40 < sVar60) * sVar40 | (ushort)(sVar40 >= sVar60) * sVar60;
          sVar60 = auVar58._6_2_;
          auVar63._6_2_ = (ushort)(sVar41 < sVar60) * sVar41 | (ushort)(sVar41 >= sVar60) * sVar60;
          sVar60 = auVar58._8_2_;
          auVar63._8_2_ = (ushort)(sVar42 < sVar60) * sVar42 | (ushort)(sVar42 >= sVar60) * sVar60;
          sVar60 = auVar58._10_2_;
          auVar63._10_2_ = (ushort)(sVar43 < sVar60) * sVar43 | (ushort)(sVar43 >= sVar60) * sVar60;
          sVar60 = auVar58._12_2_;
          sVar71 = auVar58._14_2_;
          auVar63._12_2_ = (ushort)(sVar45 < sVar60) * sVar45 | (ushort)(sVar45 >= sVar60) * sVar60;
          auVar63._14_2_ = (ushort)(sVar47 < sVar71) * sVar47 | (ushort)(sVar47 >= sVar71) * sVar71;
          auVar76 = pmovzxbw(ZEXT416(*(uint *)(puVar33 + uVar29 * 4)),
                             ZEXT416(*(uint *)(puVar33 + uVar29 * 4)));
          auVar58 = auVar63 ^ auVar49;
          auVar64._0_2_ = auVar58._0_2_ * auVar76._0_2_ + auVar63._0_2_ * sVar36 + auVar50._0_2_;
          auVar64._2_2_ = auVar58._2_2_ * auVar76._2_2_ + auVar63._2_2_ * sVar51 + auVar50._2_2_;
          auVar64._4_2_ = auVar58._4_2_ * auVar76._4_2_ + auVar63._4_2_ * sVar56 + auVar50._4_2_;
          auVar64._6_2_ = auVar58._6_2_ * auVar76._6_2_ + auVar63._6_2_ * sVar79 + auVar50._6_2_;
          auVar64._8_2_ = auVar58._8_2_ * auVar76._8_2_ + auVar63._8_2_ * sVar85 + auVar50._8_2_;
          auVar64._10_2_ =
               auVar58._10_2_ * auVar76._10_2_ + auVar63._10_2_ * sVar86 + auVar50._10_2_;
          auVar64._12_2_ =
               auVar58._12_2_ * auVar76._12_2_ + auVar63._12_2_ * sVar44 + auVar50._12_2_;
          auVar64._14_2_ =
               auVar58._14_2_ * auVar76._14_2_ + auVar63._14_2_ * sVar46 + auVar50._14_2_;
          auVar58 = pmulhuw(auVar64,auVar26);
          sVar60 = auVar58._0_2_;
          sVar71 = auVar58._2_2_;
          sVar73 = auVar58._4_2_;
          sVar11 = auVar58._6_2_;
          *(uint *)(puVar33 + uVar29 * 4) =
               CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar58[6] - (0xff < sVar11),
                        CONCAT12((0 < sVar73) * (sVar73 < 0x100) * auVar58[4] - (0xff < sVar73),
                                 CONCAT11((0 < sVar71) * (sVar71 < 0x100) * auVar58[2] -
                                          (0xff < sVar71),
                                          (0 < sVar60) * (sVar60 < 0x100) * auVar58[0] -
                                          (0xff < sVar60))));
          auVar58 = auVar59;
        }
      }
      puVar33 = puVar33 + lVar7;
      lVar28 = lVar28 + 8;
    }
    (self->_yBounds).start = 0x7fffffff;
    (self->_yBounds).end = 0;
    return;
  }
  RasterizerA2::_renderImpl<CompositorScalar,true>(self,argb32);
  return;
}

Assistant:

inline bool hasOption(uint32_t option) const noexcept { return (_options & option) != 0; }